

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper3.cpp
# Opt level: O0

void test_cpp_wrapper_range_exist_single(planck_unit_test_t *tc,Dictionary<int,_int> *dict)

{
  int local_48;
  int i;
  int records_length;
  int expected_records [2];
  int records [5];
  Dictionary<int,_int> *dict_local;
  planck_unit_test_t *tc_local;
  
  expected_records[0] = 3;
  expected_records[1] = 10;
  _i = 0x3200000019;
  for (local_48 = 0; local_48 < 5; local_48 = local_48 + 1) {
    cpp_wrapper_insert(tc,dict,expected_records[local_48],expected_records[local_48],'\x01');
  }
  cpp_wrapper_range(tc,dict,0xf,0x37,&i,2,'\x01');
  return;
}

Assistant:

void
test_cpp_wrapper_range_exist_single(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict
) {
	int records[5]			= { 3, 10, 25, 50, 70 };
	int expected_records[2] = { 25, 50 };
	int records_length		= sizeof(records) / sizeof(int);

	for (int i = 0; i < records_length; i++) {
		cpp_wrapper_insert(tc, dict, records[i], records[i], boolean_true);
	}

	cpp_wrapper_range(tc, dict, 15, 55, expected_records, 2, boolean_true);
}